

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right.cpp
# Opt level: O3

void duckdb::LeftFunction<duckdb::LeftRightGrapheme>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  Vector *pVVar5;
  data_ptr_t pdVar6;
  idx_t count;
  long *plVar7;
  sel_t *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  byte bVar10;
  undefined1 auVar11 [8];
  reference vector;
  reference vector_00;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  idx_t iVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  idx_t iVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  data_ptr_t pdVar26;
  idx_t input_length;
  ulong uVar27;
  long lVar28;
  idx_t iVar29;
  data_ptr_t pdVar30;
  data_ptr_t pdVar31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var32;
  int64_t in_R9;
  char *input_data;
  string_t sVar33;
  anon_struct_16_3_d7536bce_for_pointer aVar34;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  UnifiedVectorFormat ldata;
  undefined1 local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  data_ptr_t local_d8;
  UnifiedVectorFormat local_d0;
  data_ptr_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar4 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      pVVar5 = *(Vector **)vector->data;
      pdVar6 = *(data_ptr_t *)(vector->data + 8);
      lVar13 = *(long *)vector_00->data;
      if (lVar13 < 0) {
        local_d0.sel = (SelectionVector *)pVVar5;
        local_d0.data = pdVar6;
        pdVar30 = (data_ptr_t)((long)&local_d0.sel + 4);
        if (0xc < (uint)pVVar5) {
          pdVar30 = pdVar6;
        }
        uVar20 = (ulong)pVVar5 & 0xffffffff;
        if ((uint)pVVar5 != 0) {
          uVar24 = 0;
          do {
            if ((char)pdVar30[uVar24] < '\0') {
              uVar20 = Utf8Proc::GraphemeCount((char *)pdVar30,uVar20);
              break;
            }
            uVar24 = uVar24 + 1;
          } while (uVar20 != uVar24);
        }
        lVar21 = uVar20 + lVar13;
        lVar13 = 0;
        if (0 < lVar21) {
          lVar13 = lVar21;
        }
      }
      input_09.value.pointer.ptr = (char *)0x1;
      input_09.value._0_8_ = pdVar6;
      aVar34 = (anon_struct_16_3_d7536bce_for_pointer)
               SubstringGrapheme((duckdb *)result,pVVar5,input_09,lVar13,in_R9);
      paVar4->pointer = aVar34;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      plVar7 = (long *)vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar6 = vector->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar30 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          lVar13 = *plVar7;
          iVar29 = 0;
          do {
            lVar28 = iVar29 * 0x10;
            pVVar5 = *(Vector **)(pdVar6 + lVar28);
            pdVar25 = *(data_ptr_t *)(pdVar6 + lVar28 + 8);
            lVar21 = lVar13;
            if (lVar13 < 0) {
              local_d0.sel = (SelectionVector *)pVVar5;
              local_d0.data = pdVar25;
              pdVar26 = pdVar25;
              if ((uint)pVVar5 < 0xd) {
                pdVar26 = (data_ptr_t)((long)&local_d0.sel + 4);
              }
              sVar15 = (ulong)pVVar5 & 0xffffffff;
              if ((uint)pVVar5 != 0) {
                uVar20 = 0;
                do {
                  if ((char)pdVar26[uVar20] < '\0') {
                    sVar15 = Utf8Proc::GraphemeCount((char *)pdVar26,sVar15);
                    break;
                  }
                  uVar20 = uVar20 + 1;
                } while (sVar15 != uVar20);
              }
              lVar21 = sVar15 + lVar13;
              if ((long)(sVar15 + lVar13) < 1) {
                lVar21 = 0;
              }
            }
            input_04.value.pointer.ptr = (char *)0x1;
            input_04.value._0_8_ = pdVar25;
            sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_04,lVar21,in_R9);
            *(long *)(pdVar30 + lVar28) = sVar33.value._0_8_;
            *(long *)(pdVar30 + lVar28 + 8) = sVar33.value._8_8_;
            iVar29 = iVar29 + 1;
            if (iVar29 == count) {
              return;
            }
          } while( true );
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar24 = 0;
        uVar20 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar19 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar19 = count;
            }
LAB_01035891:
            uVar12 = uVar24;
            if (uVar24 < uVar19) {
              lVar13 = *plVar7;
              do {
                lVar28 = uVar24 * 0x10;
                pVVar5 = *(Vector **)(pdVar6 + lVar28);
                pdVar25 = *(data_ptr_t *)(pdVar6 + lVar28 + 8);
                lVar21 = lVar13;
                if (lVar13 < 0) {
                  local_d0.sel = (SelectionVector *)pVVar5;
                  local_d0.data = pdVar25;
                  pdVar26 = pdVar25;
                  if ((uint)pVVar5 < 0xd) {
                    pdVar26 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  sVar15 = (ulong)pVVar5 & 0xffffffff;
                  if ((uint)pVVar5 != 0) {
                    uVar14 = 0;
                    do {
                      if ((char)pdVar26[uVar14] < '\0') {
                        sVar15 = Utf8Proc::GraphemeCount((char *)pdVar26,sVar15);
                        break;
                      }
                      uVar14 = uVar14 + 1;
                    } while (sVar15 != uVar14);
                  }
                  lVar21 = sVar15 + lVar13;
                  if (lVar21 < 1) {
                    lVar21 = 0;
                  }
                }
                input_00.value.pointer.ptr = (char *)0x1;
                input_00.value._0_8_ = pdVar25;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_00,lVar21,in_R9);
                *(long *)(pdVar30 + lVar28) = sVar33.value._0_8_;
                *(long *)(pdVar30 + lVar28 + 8) = sVar33.value._8_8_;
                uVar24 = uVar24 + 1;
                uVar12 = uVar19;
              } while (uVar24 != uVar19);
            }
          }
          else {
            uVar14 = puVar3[uVar20];
            uVar19 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar19 = count;
            }
            uVar12 = uVar19;
            if (uVar14 != 0) {
              if (uVar14 == 0xffffffffffffffff) goto LAB_01035891;
              uVar27 = uVar24;
              uVar12 = uVar24;
              if (uVar24 < uVar19) {
                do {
                  if ((uVar14 >> ((ulong)(uint)((int)uVar27 - (int)uVar24) & 0x3f) & 1) != 0) {
                    lVar21 = uVar27 * 0x10;
                    pVVar5 = *(Vector **)(pdVar6 + lVar21);
                    pdVar25 = *(data_ptr_t *)(pdVar6 + lVar21 + 8);
                    lVar13 = *plVar7;
                    if (lVar13 < 0) {
                      local_d0.sel = (SelectionVector *)pVVar5;
                      local_d0.data = pdVar25;
                      pdVar26 = pdVar25;
                      if ((uint)pVVar5 < 0xd) {
                        pdVar26 = (data_ptr_t)((long)&local_d0.sel + 4);
                      }
                      uVar12 = (ulong)pVVar5 & 0xffffffff;
                      if ((uint)pVVar5 != 0) {
                        uVar22 = 0;
                        do {
                          if ((char)pdVar26[uVar22] < '\0') {
                            local_d8 = pdVar25;
                            uVar12 = Utf8Proc::GraphemeCount((char *)pdVar26,uVar12);
                            pdVar25 = local_d8;
                            break;
                          }
                          uVar22 = uVar22 + 1;
                        } while (uVar12 != uVar22);
                      }
                      lVar13 = uVar12 + lVar13;
                      if (lVar13 < 1) {
                        lVar13 = 0;
                      }
                    }
                    input.value.pointer.ptr = (char *)0x1;
                    input.value._0_8_ = pdVar25;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input,lVar13,in_R9);
                    *(long *)(pdVar30 + lVar21) = sVar33.value._0_8_;
                    *(long *)(pdVar30 + lVar21 + 8) = sVar33.value._8_8_;
                  }
                  uVar27 = uVar27 + 1;
                  uVar12 = uVar19;
                } while (uVar27 != uVar19);
              }
            }
          }
          uVar24 = uVar12;
          uVar20 = uVar20 + 1;
          if (uVar20 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar6 = vector->data;
          pdVar30 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar25 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              iVar29 = 0;
              do {
                lVar28 = iVar29 * 0x10;
                pVVar5 = *(Vector **)(pdVar6 + lVar28);
                pdVar26 = *(data_ptr_t *)(pdVar6 + lVar28 + 8);
                lVar13 = *(long *)(pdVar30 + iVar29 * 8);
                lVar21 = lVar13;
                if (lVar13 < 0) {
                  local_d0.sel = (SelectionVector *)pVVar5;
                  local_d0.data = pdVar26;
                  pdVar31 = pdVar26;
                  if ((uint)pVVar5 < 0xd) {
                    pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  uVar20 = (ulong)pVVar5 & 0xffffffff;
                  if ((uint)pVVar5 != 0) {
                    uVar24 = 0;
                    do {
                      if ((char)pdVar31[uVar24] < '\0') {
                        uVar20 = Utf8Proc::GraphemeCount((char *)pdVar31,uVar20);
                        break;
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar20 != uVar24);
                  }
                  lVar21 = uVar20 + lVar13;
                  if ((long)(uVar20 + lVar13) < 1) {
                    lVar21 = 0;
                  }
                }
                sVar33.value.pointer.ptr = (char *)0x1;
                sVar33.value._0_8_ = pdVar26;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,sVar33,lVar21,in_R9);
                *(long *)(pdVar25 + lVar28) = sVar33.value._0_8_;
                *(long *)(pdVar25 + lVar28 + 8) = sVar33.value._8_8_;
                iVar29 = iVar29 + 1;
              } while (iVar29 != count);
            }
          }
          else if (0x3f < count + 0x3f) {
            local_d8 = (data_ptr_t)(count + 0x3f >> 6);
            uVar24 = 0;
            uVar20 = 0;
            do {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar19 = uVar20 + 0x40;
                if (count <= uVar20 + 0x40) {
                  uVar19 = count;
                }
LAB_01036062:
                uVar12 = uVar20;
                if (uVar20 < uVar19) {
                  do {
                    lVar21 = uVar20 * 0x10;
                    pVVar5 = *(Vector **)(pdVar6 + lVar21);
                    pdVar26 = *(data_ptr_t *)(pdVar6 + lVar21 + 8);
                    lVar13 = *(long *)(pdVar30 + uVar20 * 8);
                    if (lVar13 < 0) {
                      local_d0.sel = (SelectionVector *)pVVar5;
                      local_d0.data = pdVar26;
                      pdVar31 = pdVar26;
                      if ((uint)pVVar5 < 0xd) {
                        pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
                      }
                      uVar14 = (ulong)pVVar5 & 0xffffffff;
                      if ((uint)pVVar5 != 0) {
                        uVar12 = 0;
                        do {
                          if ((char)pdVar31[uVar12] < '\0') {
                            uVar14 = Utf8Proc::GraphemeCount((char *)pdVar31,uVar14);
                            break;
                          }
                          uVar12 = uVar12 + 1;
                        } while (uVar14 != uVar12);
                      }
                      lVar13 = uVar14 + lVar13;
                      if (lVar13 < 1) {
                        lVar13 = 0;
                      }
                    }
                    input_06.value.pointer.ptr = (char *)0x1;
                    input_06.value._0_8_ = pdVar26;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_06,lVar13,in_R9);
                    *(long *)(pdVar25 + lVar21) = sVar33.value._0_8_;
                    *(long *)(pdVar25 + lVar21 + 8) = sVar33.value._8_8_;
                    uVar20 = uVar20 + 1;
                    uVar12 = uVar19;
                  } while (uVar20 != uVar19);
                }
              }
              else {
                uVar14 = puVar3[uVar24];
                uVar19 = uVar20 + 0x40;
                if (count <= uVar20 + 0x40) {
                  uVar19 = count;
                }
                uVar12 = uVar19;
                if (uVar14 != 0) {
                  if (uVar14 == 0xffffffffffffffff) goto LAB_01036062;
                  uVar12 = uVar20;
                  uVar27 = uVar20;
                  if (uVar20 < uVar19) {
                    do {
                      if ((uVar14 >> ((ulong)(uint)((int)uVar27 - (int)uVar20) & 0x3f) & 1) != 0) {
                        lVar21 = uVar27 * 0x10;
                        pVVar5 = *(Vector **)(pdVar6 + lVar21);
                        pdVar26 = *(data_ptr_t *)(pdVar6 + lVar21 + 8);
                        lVar13 = *(long *)(pdVar30 + uVar27 * 8);
                        if (lVar13 < 0) {
                          local_d0.sel = (SelectionVector *)pVVar5;
                          local_d0.data = pdVar26;
                          pdVar31 = pdVar26;
                          if ((uint)pVVar5 < 0xd) {
                            pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
                          }
                          uVar12 = (ulong)pVVar5 & 0xffffffff;
                          if ((uint)pVVar5 != 0) {
                            uVar22 = 0;
                            do {
                              if ((char)pdVar31[uVar22] < '\0') {
                                local_88 = pdVar26;
                                uVar12 = Utf8Proc::GraphemeCount((char *)pdVar31,uVar12);
                                pdVar26 = local_88;
                                break;
                              }
                              uVar22 = uVar22 + 1;
                            } while (uVar12 != uVar22);
                          }
                          lVar13 = uVar12 + lVar13;
                          if (lVar13 < 1) {
                            lVar13 = 0;
                          }
                        }
                        input_05.value.pointer.ptr = (char *)0x1;
                        input_05.value._0_8_ = pdVar26;
                        sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_05,lVar13,in_R9);
                        *(long *)(pdVar25 + lVar21) = sVar33.value._0_8_;
                        *(long *)(pdVar25 + lVar21 + 8) = sVar33.value._8_8_;
                      }
                      uVar27 = uVar27 + 1;
                      uVar12 = uVar19;
                    } while (uVar27 != uVar19);
                  }
                }
              }
              uVar24 = uVar24 + 1;
              uVar20 = uVar12;
            } while ((data_ptr_t)uVar24 != local_d8);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_d0);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,count,&local_d0);
          Vector::ToUnifiedFormat(vector_00,count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar13 = *(long *)local_d0.sel;
              psVar8 = (local_78.sel)->sel_vector;
              iVar29 = 0;
              do {
                iVar16 = iVar29;
                if (lVar13 != 0) {
                  iVar16 = (idx_t)*(uint *)(lVar13 + iVar29 * 4);
                }
                iVar23 = iVar29;
                if (psVar8 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar8[iVar29];
                }
                pVVar5 = *(Vector **)(local_d0.data + iVar16 * 0x10);
                p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          (local_d0.data + iVar16 * 0x10 + 8);
                lVar21 = *(long *)(local_78.data + iVar23 * 8);
                if (lVar21 < 0) {
                  p_Stack_e0 = p_Var9;
                  p_Var32 = p_Var9;
                  if ((uint)pVVar5 < 0xd) {
                    p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
                  }
                  uVar20 = (ulong)pVVar5 & 0xffffffff;
                  local_e8 = (undefined1  [8])pVVar5;
                  if ((uint)pVVar5 != 0) {
                    uVar24 = 0;
                    do {
                      if (*(char *)((long)&p_Var32->_vptr__Sp_counted_base + uVar24) < '\0') {
                        uVar20 = Utf8Proc::GraphemeCount((char *)p_Var32,uVar20);
                        break;
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar20 != uVar24);
                  }
                  lVar21 = uVar20 + lVar21;
                  if (lVar21 < 1) {
                    lVar21 = 0;
                  }
                }
                input_01.value.pointer.ptr = (char *)0x1;
                input_01.value._0_8_ = p_Var9;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_01,lVar21,in_R9);
                *(long *)(pdVar6 + iVar29 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar6 + iVar29 * 0x10 + 8) = sVar33.value._8_8_;
                iVar29 = iVar29 + 1;
              } while (iVar29 != count);
            }
          }
          else if (count != 0) {
            lVar13 = *(long *)local_d0.sel;
            psVar8 = (local_78.sel)->sel_vector;
            uVar20 = 0;
            do {
              uVar24 = uVar20;
              if (lVar13 != 0) {
                uVar24 = (ulong)*(uint *)(lVar13 + uVar20 * 4);
              }
              uVar19 = uVar20;
              if (psVar8 != (sel_t *)0x0) {
                uVar19 = (ulong)psVar8[uVar20];
              }
              if (((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)))) {
                pVVar5 = *(Vector **)(local_d0.data + uVar24 * 0x10);
                p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          (local_d0.data + uVar24 * 0x10 + 8);
                lVar21 = *(long *)(local_78.data + uVar19 * 8);
                if (lVar21 < 0) {
                  p_Stack_e0 = p_Var9;
                  p_Var32 = p_Var9;
                  if ((uint)pVVar5 < 0xd) {
                    p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
                  }
                  uVar24 = (ulong)pVVar5 & 0xffffffff;
                  local_e8 = (undefined1  [8])pVVar5;
                  if ((uint)pVVar5 != 0) {
                    uVar19 = 0;
                    do {
                      if (*(char *)((long)&p_Var32->_vptr__Sp_counted_base + uVar19) < '\0') {
                        uVar24 = Utf8Proc::GraphemeCount((char *)p_Var32,uVar24);
                        break;
                      }
                      uVar19 = uVar19 + 1;
                    } while (uVar24 != uVar19);
                  }
                  lVar21 = uVar24 + lVar21;
                  if (lVar21 < 1) {
                    lVar21 = 0;
                  }
                }
                input_07.value.pointer.ptr = (char *)0x1;
                input_07.value._0_8_ = p_Var9;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_07,lVar21,in_R9);
                *(long *)(pdVar6 + uVar20 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar6 + uVar20 * 0x10 + 8) = sVar33.value._8_8_;
              }
              else {
                _Var18._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var18._M_head_impl == (unsigned_long *)0x0) {
                  local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_e8,&local_80);
                  p_Var32 = p_Stack_e0;
                  auVar11 = local_e8;
                  local_e8 = (undefined1  [8])0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar11;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var32;
                  if ((p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var18._M_head_impl =
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var18._M_head_impl;
                }
                bVar10 = (byte)uVar20 & 0x3f;
                _Var18._M_head_impl[uVar20 >> 6] =
                     _Var18._M_head_impl[uVar20 >> 6] &
                     (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != count);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_d0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar6 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar30 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar25 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          pVVar5 = *(Vector **)pdVar6;
          pdVar6 = *(data_ptr_t *)(pdVar6 + 8);
          pdVar26 = (data_ptr_t)((long)&local_d0.sel + 4);
          if (0xc < (uint)pVVar5) {
            pdVar26 = pdVar6;
          }
          uVar20 = (ulong)pVVar5 & 0xffffffff;
          iVar29 = 0;
          do {
            lVar13 = *(long *)(pdVar30 + iVar29 * 8);
            if (lVar13 < 0) {
              local_d0.sel = (SelectionVector *)pVVar5;
              local_d0.data = pdVar6;
              uVar24 = uVar20;
              if ((uint)pVVar5 != 0) {
                uVar19 = 0;
                do {
                  if ((char)pdVar26[uVar19] < '\0') {
                    uVar24 = Utf8Proc::GraphemeCount((char *)pdVar26,uVar20);
                    break;
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar20 != uVar19);
              }
              lVar13 = uVar24 + lVar13;
              if (lVar13 < 1) {
                lVar13 = 0;
              }
            }
            input_08.value.pointer.ptr = (char *)0x1;
            input_08.value._0_8_ = pdVar6;
            sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_08,lVar13,in_R9);
            *(long *)(pdVar25 + iVar29 * 0x10) = sVar33.value._0_8_;
            *(long *)(pdVar25 + iVar29 * 0x10 + 8) = sVar33.value._8_8_;
            iVar29 = iVar29 + 1;
            if (iVar29 == count) {
              return;
            }
          } while( true );
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar24 = 0;
        uVar20 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar19 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar19 = count;
            }
LAB_01035cf8:
            uVar12 = uVar24;
            if (uVar24 < uVar19) {
              pVVar5 = *(Vector **)pdVar6;
              pdVar26 = *(data_ptr_t *)(pdVar6 + 8);
              pdVar31 = pdVar26;
              if ((uint)pVVar5 < 0xd) {
                pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
              }
              uVar14 = (ulong)pVVar5 & 0xffffffff;
              do {
                lVar13 = *(long *)(pdVar30 + uVar24 * 8);
                if (lVar13 < 0) {
                  local_d0.sel = (SelectionVector *)pVVar5;
                  local_d0.data = pdVar26;
                  uVar12 = uVar14;
                  if ((uint)pVVar5 != 0) {
                    uVar27 = 0;
                    do {
                      if ((char)pdVar31[uVar27] < '\0') {
                        uVar12 = Utf8Proc::GraphemeCount((char *)pdVar31,uVar14);
                        break;
                      }
                      uVar27 = uVar27 + 1;
                    } while (uVar14 != uVar27);
                  }
                  lVar13 = uVar12 + lVar13;
                  if (lVar13 < 1) {
                    lVar13 = 0;
                  }
                }
                input_03.value.pointer.ptr = (char *)0x1;
                input_03.value._0_8_ = pdVar26;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_03,lVar13,in_R9);
                *(long *)(pdVar25 + uVar24 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar25 + uVar24 * 0x10 + 8) = sVar33.value._8_8_;
                uVar24 = uVar24 + 1;
                uVar12 = uVar19;
              } while (uVar24 != uVar19);
            }
          }
          else {
            uVar14 = puVar3[uVar20];
            uVar19 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar19 = count;
            }
            uVar12 = uVar19;
            if (uVar14 != 0) {
              if (uVar14 == 0xffffffffffffffff) goto LAB_01035cf8;
              uVar27 = uVar24;
              uVar12 = uVar24;
              if (uVar24 < uVar19) {
                do {
                  if ((uVar14 >> ((ulong)(uint)((int)uVar27 - (int)uVar24) & 0x3f) & 1) != 0) {
                    pVVar5 = *(Vector **)pdVar6;
                    pdVar26 = *(data_ptr_t *)(pdVar6 + 8);
                    lVar13 = *(long *)(pdVar30 + uVar27 * 8);
                    if (lVar13 < 0) {
                      local_d0.sel = (SelectionVector *)pVVar5;
                      local_d0.data = pdVar26;
                      pdVar31 = pdVar26;
                      if ((uint)pVVar5 < 0xd) {
                        pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
                      }
                      uVar12 = (ulong)pVVar5 & 0xffffffff;
                      if ((uint)pVVar5 != 0) {
                        uVar22 = 0;
                        do {
                          if ((char)pdVar31[uVar22] < '\0') {
                            uVar12 = Utf8Proc::GraphemeCount((char *)pdVar31,uVar12);
                            break;
                          }
                          uVar22 = uVar22 + 1;
                        } while (uVar12 != uVar22);
                      }
                      lVar13 = uVar12 + lVar13;
                      if (lVar13 < 1) {
                        lVar13 = 0;
                      }
                    }
                    input_02.value.pointer.ptr = (char *)0x1;
                    input_02.value._0_8_ = pdVar26;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_02,lVar13,in_R9);
                    *(long *)(pdVar25 + uVar27 * 0x10) = sVar33.value._0_8_;
                    *(long *)(pdVar25 + uVar27 * 0x10 + 8) = sVar33.value._8_8_;
                  }
                  uVar27 = uVar27 + 1;
                  uVar12 = uVar19;
                } while (uVar27 != uVar19);
              }
            }
          }
          uVar24 = uVar12;
          uVar20 = uVar20 + 1;
          if (uVar20 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void LeftFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &pos_vec = args.data[1];

	BinaryExecutor::Execute<string_t, int64_t, string_t>(
	    str_vec, pos_vec, result, args.size(),
	    [&](string_t str, int64_t pos) { return LeftScalarFunction<OP>(result, str, pos); });
}